

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::JoinDefines
          (cmLocalGenerator *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *defines,string *definesString,string *lang)

{
  cmMakefile *this_00;
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  string *psVar4;
  cmState *this_01;
  reference pcVar5;
  string_view str;
  string local_1d0 [32];
  string_view local_1b0;
  string local_1a0;
  string local_180 [32];
  long local_160;
  size_type eq;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_150;
  char c;
  const_iterator __end3;
  const_iterator __begin3;
  string *__range3;
  string def;
  string *define;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  char *itemSeparator;
  cmAlphaNum local_e8;
  cmAlphaNum local_b8;
  string local_88;
  cmValue local_68;
  cmValue df;
  allocator<char> local_49;
  string local_48 [8];
  string dflag;
  string *lang_local;
  string *definesString_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *defines_local;
  cmLocalGenerator *this_local;
  
  dflag.field_2._8_8_ = lang;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"-D",&local_49);
  std::allocator<char>::~allocator(&local_49);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    this_00 = this->Makefile;
    cmAlphaNum::cmAlphaNum(&local_b8,"CMAKE_");
    cmAlphaNum::cmAlphaNum(&local_e8,(string *)dflag.field_2._8_8_);
    cmStrCat<char[13]>(&local_88,&local_b8,&local_e8,(char (*) [13])"_DEFINE_FLAG");
    local_68 = cmMakefile::GetDefinition(this_00,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    bVar1 = cmNonempty(local_68);
    if (bVar1) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_68);
      std::__cxx11::string::operator=(local_48,(string *)psVar4);
    }
  }
  bVar2 = std::__cxx11::string::empty();
  __range1 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xc343ef;
  if ((bVar2 & 1) != 0) {
    __range1 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0xc7f107;
  }
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(defines);
  define = (string *)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(defines);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&define);
    if (!bVar1) break;
    def.field_2._8_8_ =
         std::
         _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*(&__end1);
    std::__cxx11::string::string((string *)&__range3,local_48);
    this_01 = GetState(this);
    bVar1 = cmState::UseWatcomWMake(this_01);
    if (bVar1) {
      __end3._M_current = (char *)std::__cxx11::string::begin();
      _Stack_150._M_current = (char *)std::__cxx11::string::end();
      while( true ) {
        bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffeb0);
        if (!bVar1) break;
        pcVar5 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end3);
        eq._7_1_ = *pcVar5;
        if ((eq._7_1_ == '$') || (eq._7_1_ == '#')) {
          std::__cxx11::string::operator+=((string *)&__range3,'$');
        }
        std::__cxx11::string::operator+=((string *)&__range3,eq._7_1_);
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end3);
      }
    }
    else {
      local_160 = std::__cxx11::string::find((char)def.field_2._8_8_,0x3d);
      std::__cxx11::string::substr((ulong)local_180,def.field_2._8_8_);
      std::__cxx11::string::operator+=((string *)&__range3,local_180);
      std::__cxx11::string::~string(local_180);
      if (local_160 != -1) {
        std::__cxx11::string::operator+=((string *)&__range3,"=");
        std::__cxx11::string::substr((ulong)local_1d0,def.field_2._8_8_);
        str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_1d0);
        local_1b0 = str;
        cmOutputConverter::EscapeForShell_abi_cxx11_
                  (&local_1a0,&this->super_cmOutputConverter,str,true,false,false,false,false);
        std::__cxx11::string::operator+=((string *)&__range3,(string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string(local_1d0);
      }
    }
    std::__cxx11::string::operator+=((string *)definesString,(char *)__range1);
    __range1 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0xc343ef;
    std::__cxx11::string::operator+=((string *)definesString,(string *)&__range3);
    std::__cxx11::string::~string((string *)&__range3);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void cmLocalGenerator::JoinDefines(const std::set<std::string>& defines,
                                   std::string& definesString,
                                   const std::string& lang)
{
  // Lookup the define flag for the current language.
  std::string dflag = "-D";
  if (!lang.empty()) {
    cmValue df =
      this->Makefile->GetDefinition(cmStrCat("CMAKE_", lang, "_DEFINE_FLAG"));
    if (cmNonempty(df)) {
      dflag = *df;
    }
  }
  const char* itemSeparator = definesString.empty() ? "" : " ";
  for (std::string const& define : defines) {
    // Append the definition with proper escaping.
    std::string def = dflag;
    if (this->GetState()->UseWatcomWMake()) {
      // The Watcom compiler does its own command line parsing instead
      // of using the windows shell rules.  Definitions are one of
      //   -DNAME
      //   -DNAME=<cpp-token>
      //   -DNAME="c-string with spaces and other characters(?@#$)"
      //
      // Watcom will properly parse each of these cases from the
      // command line without any escapes.  However we still have to
      // get the '$' and '#' characters through WMake as '$$' and
      // '$#'.
      for (char c : define) {
        if (c == '$' || c == '#') {
          def += '$';
        }
        def += c;
      }
    } else {
      // Make the definition appear properly on the command line.  Use
      // -DNAME="value" instead of -D"NAME=value" for historical reasons.
      std::string::size_type eq = define.find('=');
      def += define.substr(0, eq);
      if (eq != std::string::npos) {
        def += "=";
        def += this->EscapeForShell(define.substr(eq + 1), true);
      }
    }
    definesString += itemSeparator;
    itemSeparator = " ";
    definesString += def;
  }
}